

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::TeamCityReporter::testCaseEnded(TeamCityReporter *this,TestCaseStats *testCaseStats)

{
  uint uVar1;
  ulong uVar2;
  ostream *poVar3;
  size_type in_RCX;
  StringRef str;
  StringRef str_00;
  StringRef str_01;
  StringRef str_02;
  StringRef str_03;
  StringRef local_120;
  string local_110;
  StringRef local_f0;
  string local_e0;
  StringRef local_c0;
  string local_b0;
  StringRef local_90;
  string local_80;
  StringRef local_50;
  string local_40;
  string *local_20;
  TestCaseInfo *testCaseInfo;
  TestCaseStats *testCaseStats_local;
  TeamCityReporter *this_local;
  
  testCaseInfo = (TestCaseInfo *)testCaseStats;
  testCaseStats_local = (TestCaseStats *)this;
  StreamingReporterBase::testCaseEnded(&this->super_StreamingReporterBase,testCaseStats);
  local_20 = *(string **)&testCaseInfo->name;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    poVar3 = std::operator<<((this->super_StreamingReporterBase).super_ReporterBase.m_stream,
                             "##teamcity[testStdOut name=\'");
    StringRef::StringRef(&local_50,local_20);
    str.m_size = in_RCX;
    str.m_start = (char *)local_50.m_size;
    (anonymous_namespace)::escape_abi_cxx11_
              (&local_40,(_anonymous_namespace_ *)local_50.m_start,str);
    poVar3 = std::operator<<(poVar3,(string *)&local_40);
    poVar3 = std::operator<<(poVar3,"\' out=\'");
    StringRef::StringRef(&local_90,(string *)((long)&(testCaseInfo->backingTags).field_2 + 8));
    str_00.m_size = in_RCX;
    str_00.m_start = (char *)local_90.m_size;
    (anonymous_namespace)::escape_abi_cxx11_
              (&local_80,(_anonymous_namespace_ *)local_90.m_start,str_00);
    poVar3 = std::operator<<(poVar3,(string *)&local_80);
    std::operator<<(poVar3,"\']\n");
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_40);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    poVar3 = std::operator<<((this->super_StreamingReporterBase).super_ReporterBase.m_stream,
                             "##teamcity[testStdErr name=\'");
    StringRef::StringRef(&local_c0,local_20);
    str_01.m_size = in_RCX;
    str_01.m_start = (char *)local_c0.m_size;
    (anonymous_namespace)::escape_abi_cxx11_
              (&local_b0,(_anonymous_namespace_ *)local_c0.m_start,str_01);
    poVar3 = std::operator<<(poVar3,(string *)&local_b0);
    poVar3 = std::operator<<(poVar3,"\' out=\'");
    StringRef::StringRef(&local_f0,(string *)&testCaseInfo->lineInfo);
    str_02.m_size = in_RCX;
    str_02.m_start = (char *)local_f0.m_size;
    (anonymous_namespace)::escape_abi_cxx11_
              (&local_e0,(_anonymous_namespace_ *)local_f0.m_start,str_02);
    poVar3 = std::operator<<(poVar3,(string *)&local_e0);
    std::operator<<(poVar3,"\']\n");
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  poVar3 = std::operator<<((this->super_StreamingReporterBase).super_ReporterBase.m_stream,
                           "##teamcity[testFinished name=\'");
  StringRef::StringRef(&local_120,local_20);
  str_03.m_size = in_RCX;
  str_03.m_start = (char *)local_120.m_size;
  (anonymous_namespace)::escape_abi_cxx11_
            (&local_110,(_anonymous_namespace_ *)local_120.m_start,str_03);
  poVar3 = std::operator<<(poVar3,(string *)&local_110);
  poVar3 = std::operator<<(poVar3,"\' duration=\'");
  uVar1 = Timer::getElapsedMilliseconds(&this->m_testTimer);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar1);
  std::operator<<(poVar3,"\']\n");
  std::__cxx11::string::~string((string *)&local_110);
  std::ostream::flush();
  return;
}

Assistant:

void TeamCityReporter::testCaseEnded(TestCaseStats const& testCaseStats) {
        StreamingReporterBase::testCaseEnded(testCaseStats);
        auto const& testCaseInfo = *testCaseStats.testInfo;
        if (!testCaseStats.stdOut.empty())
            m_stream << "##teamcity[testStdOut name='"
            << escape(testCaseInfo.name)
            << "' out='" << escape(testCaseStats.stdOut) << "']\n";
        if (!testCaseStats.stdErr.empty())
            m_stream << "##teamcity[testStdErr name='"
            << escape(testCaseInfo.name)
            << "' out='" << escape(testCaseStats.stdErr) << "']\n";
        m_stream << "##teamcity[testFinished name='"
            << escape(testCaseInfo.name) << "' duration='"
            << m_testTimer.getElapsedMilliseconds() << "']\n";
        m_stream.flush();
    }